

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstructionFolder::BinaryOperate
          (InstructionFolder *this,Op opcode,uint32_t a,uint32_t b)

{
  byte bVar1;
  bool local_32;
  bool local_31;
  uint32_t b_local;
  uint32_t a_local;
  Op opcode_local;
  InstructionFolder *this_local;
  
  bVar1 = (byte)b;
  switch(opcode) {
  case OpLogicalEqual:
    this_local._4_4_ = (uint)((a != 0) == (b != 0));
    break;
  case OpLogicalNotEqual:
    this_local._4_4_ = (uint)((a != 0) != (b != 0));
    break;
  case OpLogicalOr:
    local_31 = a != 0 || b != 0;
    this_local._4_4_ = (uint)local_31;
    break;
  case OpLogicalAnd:
    local_32 = a != 0 && b != 0;
    this_local._4_4_ = (uint)local_32;
    break;
  default:
    __assert_fail("false && \"Unsupported binary operation for OpSpecConstantOp instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x93,
                  "uint32_t spvtools::opt::InstructionFolder::BinaryOperate(spv::Op, uint32_t, uint32_t) const"
                 );
  case OpIEqual:
    this_local._4_4_ = (uint)(a == b);
    break;
  case OpINotEqual:
    this_local._4_4_ = (uint)(a != b);
    break;
  case OpUGreaterThan:
    this_local._4_4_ = (uint)(b < a);
    break;
  case OpSGreaterThan:
    this_local._4_4_ = (uint)((int)b < (int)a);
    break;
  case OpUGreaterThanEqual:
    this_local._4_4_ = (uint)(b <= a);
    break;
  case OpSGreaterThanEqual:
    this_local._4_4_ = (uint)((int)b <= (int)a);
    break;
  case OpULessThan:
    this_local._4_4_ = (uint)(a < b);
    break;
  case OpSLessThan:
    this_local._4_4_ = (uint)((int)a < (int)b);
    break;
  case OpULessThanEqual:
    this_local._4_4_ = (uint)(a <= b);
    break;
  case OpSLessThanEqual:
    this_local._4_4_ = (uint)((int)a <= (int)b);
    break;
  case OpShiftRightLogical:
    if (b < 0x20) {
      this_local._4_4_ = a >> (bVar1 & 0x1f);
    }
    else {
      this_local._4_4_ = 0;
    }
    break;
  case OpShiftRightArithmetic:
    if (b < 0x21) {
      if (b == 0x20) {
        if ((int)a < 0) {
          this_local._4_4_ = 0xffffffff;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = (int)a >> (bVar1 & 0x1f);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
    break;
  case OpShiftLeftLogical:
    if (b < 0x20) {
      this_local._4_4_ = a << (bVar1 & 0x1f);
    }
    else {
      this_local._4_4_ = 0;
    }
    break;
  case OpBitwiseOr:
    this_local._4_4_ = a | b;
    break;
  case OpBitwiseXor:
    this_local._4_4_ = a ^ b;
    break;
  case OpBitwiseAnd:
    this_local._4_4_ = a & b;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InstructionFolder::BinaryOperate(spv::Op opcode, uint32_t a,
                                          uint32_t b) const {
  switch (opcode) {
    // Shifting
    case spv::Op::OpShiftRightLogical:
      if (b >= 32) {
        // This is undefined behaviour when |b| > 32.  Choose 0 for consistency.
        // When |b| == 32, doing the shift in C++ in undefined, but the result
        // will be 0, so just return that value.
        return 0;
      }
      return a >> b;
    case spv::Op::OpShiftRightArithmetic:
      if (b > 32) {
        // This is undefined behaviour.  Choose 0 for consistency.
        return 0;
      }
      if (b == 32) {
        // Doing the shift in C++ is undefined, but the result is defined in the
        // spir-v spec.  Find that value another way.
        if (static_cast<int32_t>(a) >= 0) {
          return 0;
        } else {
          return static_cast<uint32_t>(-1);
        }
      }
      return (static_cast<int32_t>(a)) >> b;
    case spv::Op::OpShiftLeftLogical:
      if (b >= 32) {
        // This is undefined behaviour when |b| > 32.  Choose 0 for consistency.
        // When |b| == 32, doing the shift in C++ in undefined, but the result
        // will be 0, so just return that value.
        return 0;
      }
      return a << b;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      return a | b;
    case spv::Op::OpBitwiseAnd:
      return a & b;
    case spv::Op::OpBitwiseXor:
      return a ^ b;

    // Logical
    case spv::Op::OpLogicalEqual:
      return (static_cast<bool>(a)) == (static_cast<bool>(b));
    case spv::Op::OpLogicalNotEqual:
      return (static_cast<bool>(a)) != (static_cast<bool>(b));
    case spv::Op::OpLogicalOr:
      return (static_cast<bool>(a)) || (static_cast<bool>(b));
    case spv::Op::OpLogicalAnd:
      return (static_cast<bool>(a)) && (static_cast<bool>(b));

    // Comparison
    case spv::Op::OpIEqual:
      return a == b;
    case spv::Op::OpINotEqual:
      return a != b;
    case spv::Op::OpULessThan:
      return a < b;
    case spv::Op::OpSLessThan:
      return (static_cast<int32_t>(a)) < (static_cast<int32_t>(b));
    case spv::Op::OpUGreaterThan:
      return a > b;
    case spv::Op::OpSGreaterThan:
      return (static_cast<int32_t>(a)) > (static_cast<int32_t>(b));
    case spv::Op::OpULessThanEqual:
      return a <= b;
    case spv::Op::OpSLessThanEqual:
      return (static_cast<int32_t>(a)) <= (static_cast<int32_t>(b));
    case spv::Op::OpUGreaterThanEqual:
      return a >= b;
    case spv::Op::OpSGreaterThanEqual:
      return (static_cast<int32_t>(a)) >= (static_cast<int32_t>(b));
    default:
      assert(false &&
             "Unsupported binary operation for OpSpecConstantOp instruction");
      return 0u;
  }
}